

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTxInReference::EstimateTxInVsize
          (ConfidentialTxInReference *this,AddressType addr_type,Script *redeem_script,bool is_blind
          ,int exponent,int minimum_bits,Script *claim_script,Script *scriptsig_template)

{
  uint32_t exponent_00;
  byte bVar1;
  uint32_t uVar2;
  Script local_a8;
  Script local_70;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t no_witness_size;
  uint32_t witness_size;
  int minimum_bits_local;
  int exponent_local;
  bool is_blind_local;
  Script *redeem_script_local;
  ConfidentialTxInReference *pCStack_10;
  AddressType addr_type_local;
  ConfidentialTxInReference *this_local;
  
  local_30 = 0;
  local_34 = 0;
  no_witness_size = minimum_bits;
  witness_size = exponent;
  minimum_bits_local._3_1_ = is_blind;
  _exponent_local = redeem_script;
  redeem_script_local._4_4_ = addr_type;
  pCStack_10 = this;
  Script::Script(&local_70,redeem_script);
  bVar1 = minimum_bits_local._3_1_;
  exponent_00 = witness_size;
  uVar2 = no_witness_size;
  Script::Script(&local_a8,claim_script);
  EstimateTxInSize(this,addr_type,&local_70,(bool)(bVar1 & 1),exponent_00,uVar2,&local_a8,
                   scriptsig_template,&local_30,&local_34);
  Script::~Script(&local_a8);
  Script::~Script(&local_70);
  uVar2 = AbstractTransaction::GetVsizeFromSize(local_34,local_30);
  return uVar2;
}

Assistant:

uint32_t ConfidentialTxInReference::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script, bool is_blind, int exponent,
    int minimum_bits, Script claim_script,
    const Script *scriptsig_template) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  EstimateTxInSize(
      addr_type, redeem_script, is_blind, exponent, minimum_bits, claim_script,
      scriptsig_template, &witness_size, &no_witness_size);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}